

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_internal.h
# Opt level: O2

GetAddressInfoResponseStruct * __thiscall
cfd::js::api::
ExecuteStructApi<cfd::js::api::GetAddressInfoRequestStruct,cfd::js::api::GetAddressInfoResponseStruct>
          (GetAddressInfoResponseStruct *__return_storage_ptr__,api *this,
          GetAddressInfoRequestStruct *request,
          function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
          *call_function,string *fuction_name)

{
  GetAddressInfoResponseStruct local_158;
  
  GetAddressInfoResponseStruct::GetAddressInfoResponseStruct(__return_storage_ptr__);
  cfd::Initialize();
  std::
  function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
  ::operator()(&local_158,
               (function<cfd::js::api::GetAddressInfoResponseStruct_(const_cfd::js::api::GetAddressInfoRequestStruct_&)>
                *)request,(GetAddressInfoRequestStruct *)this);
  GetAddressInfoResponseStruct::operator=(__return_storage_ptr__,&local_158);
  GetAddressInfoResponseStruct::~GetAddressInfoResponseStruct(&local_158);
  return __return_storage_ptr__;
}

Assistant:

ResponseStructType ExecuteStructApi(
    const RequestStructType& request,
    std::function<ResponseStructType(const RequestStructType&)> call_function,
    std::string fuction_name) {
  ResponseStructType response;
  try {
    cfd::Initialize();

    response = call_function(request);
  } catch (const CfdException& cfde) {
    warn(
        CFD_LOG_SOURCE,
        "Failed to {}. CfdException occurred:  code={}, message={}",
        fuction_name, cfde.GetErrorCode(), cfde.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(cfde);
  } catch (const std::exception& except) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Exception occurred: message={}",
        fuction_name, except.what());
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  } catch (...) {
    warn(
        CFD_LOG_SOURCE, "Failed to {}. Unknown exception occurred.",
        fuction_name);
    response.error = cfd::js::api::ConvertCfdExceptionToStruct(CfdException());
  }
  return response;
}